

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.cpp
# Opt level: O1

void __thiscall
Js::DynamicProfileInfo::CreatePolymorphicDynamicProfileCallSiteInfo
          (DynamicProfileInfo *this,FunctionBody *funcBody,ProfileId callSiteId,
          LocalFunctionId functionId,LocalFunctionId oldFunctionId,SourceId sourceId,
          SourceId oldSourceId)

{
  ushort *puVar1;
  code *pcVar2;
  bool bVar3;
  int i;
  ScriptContext *pSVar4;
  Recycler *alloc;
  LocalFunctionId *ptr;
  void *pvVar5;
  long lVar6;
  undefined4 *puVar7;
  char *addr;
  undefined1 local_70 [8];
  TrackAllocData data;
  
  data._32_8_ = this;
  pSVar4 = FunctionProxy::GetScriptContext((FunctionProxy *)funcBody);
  local_70 = (undefined1  [8])&PolymorphicCallSiteInfo::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_499f363;
  data.filename._0_4_ = 0x335;
  alloc = Memory::Recycler::TrackAllocInfo(pSVar4->recycler,(TrackAllocData *)local_70);
  ptr = (LocalFunctionId *)new<Memory::Recycler>(0x28,alloc,0x572640);
  ptr[8] = 0;
  ptr[9] = 0;
  *ptr = oldFunctionId;
  ptr[1] = functionId;
  ptr[4] = oldSourceId;
  ptr[5] = sourceId;
  pvVar5 = FunctionProxy::GetAuxPtr((FunctionProxy *)funcBody,PolymorphicCallSiteInfoHead);
  Memory::Recycler::WBSetBit((char *)(ptr + 8));
  *(void **)(ptr + 8) = pvVar5;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(ptr + 8);
  lVar6 = 2;
  do {
    ptr[lVar6] = 0xfffffffc;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 4);
  bVar3 = CCLock::IsLocked((CCLock *)&callSiteInfoCS);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                ,0x343,"(this->callSiteInfoCS.IsLocked())",
                                "this->callSiteInfoCS.IsLocked()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar7 = 0;
  }
  puVar1 = (ushort *)(*(long *)(data._32_8_ + 8) + 2 + (ulong)callSiteId * 0x10);
  *puVar1 = *puVar1 | 0x8000;
  addr = (char *)(*(long *)(data._32_8_ + 8) + (ulong)callSiteId * 0x10 + 8);
  Memory::Recycler::WBSetBit(addr);
  *(LocalFunctionId **)addr = ptr;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  FunctionProxy::SetAuxPtr((FunctionProxy *)funcBody,PolymorphicCallSiteInfoHead,ptr);
  return;
}

Assistant:

void DynamicProfileInfo::CreatePolymorphicDynamicProfileCallSiteInfo(FunctionBody *funcBody, ProfileId callSiteId, Js::LocalFunctionId functionId, Js::LocalFunctionId oldFunctionId, Js::SourceId sourceId, Js::SourceId oldSourceId)
    {
        PolymorphicCallSiteInfo *localPolyCallSiteInfo = RecyclerNewStructZ(funcBody->GetScriptContext()->GetRecycler(), PolymorphicCallSiteInfo);

        Assert(maxPolymorphicInliningSize >= 2);
        localPolyCallSiteInfo->functionIds[0] = oldFunctionId;
        localPolyCallSiteInfo->functionIds[1] = functionId;
        localPolyCallSiteInfo->sourceIds[0] = oldSourceId;
        localPolyCallSiteInfo->sourceIds[1] = sourceId;
        localPolyCallSiteInfo->next = funcBody->GetPolymorphicCallSiteInfoHead();

        for (int i = 2; i < maxPolymorphicInliningSize; i++)
        {
            localPolyCallSiteInfo->functionIds[i] = CallSiteNoInfo;
        }

        Assert(this->callSiteInfoCS.IsLocked());
        callSiteInfo[callSiteId].isPolymorphic = true;
        callSiteInfo[callSiteId].u.polymorphicCallSiteInfo = localPolyCallSiteInfo;
        funcBody->SetPolymorphicCallSiteInfoHead(localPolyCallSiteInfo);
    }